

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_stream_sync_sendbuf(quicly_stream_t *stream,int activate)

{
  int iVar1;
  
  if ((activate != 0) && (iVar1 = quicly_sendstate_activate(&stream->sendstate), iVar1 != 0)) {
    return iVar1;
  }
  resched_stream_data(stream);
  return 0;
}

Assistant:

int quicly_stream_sync_sendbuf(quicly_stream_t *stream, int activate)
{
    int ret;

    if (activate) {
        if ((ret = quicly_sendstate_activate(&stream->sendstate)) != 0)
            return ret;
    }

    resched_stream_data(stream);
    return 0;
}